

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::decodeNumber(OurReader *this,Token *token)

{
  bool bVar1;
  Value *this_00;
  long in_RSI;
  long in_RDI;
  Value decoded;
  Value *in_stack_ffffffffffffff78;
  Value *in_stack_ffffffffffffff80;
  ValueType in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  Value::Value((Value *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
  bVar1 = decodeNumber((OurReader *)
                       decoded.comments_.ptr_._M_t.
                       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                       .
                       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                       ._M_head_impl,(Token *)decoded._8_8_,decoded.value_);
  if (bVar1) {
    currentValue((OurReader *)0x1ecd3c);
    Value::swapPayload(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    this_00 = currentValue((OurReader *)0x1ecd5e);
    Value::setOffsetStart(this_00,*(long *)(in_RSI + 8) - *(long *)(in_RDI + 0xc0));
    in_stack_ffffffffffffff80 = currentValue((OurReader *)0x1ecd93);
    Value::setOffsetLimit
              (in_stack_ffffffffffffff80,*(long *)(in_RSI + 0x10) - *(long *)(in_RDI + 0xc0));
  }
  Value::~Value(in_stack_ffffffffffffff80);
  return bVar1;
}

Assistant:

bool OurReader::decodeNumber(Token& token) {
  Value decoded;
  if (!decodeNumber(token, decoded))
    return false;
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}